

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_pad_dists(Omega_h *this,Mesh *mesh,Int pad_dim,Read<signed_char> *edges_are_bridges)

{
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *extraout_RDX;
  char *pcVar5;
  char *pcVar6;
  Alloc *this_00;
  Reals RVar7;
  Read<signed_char> local_70;
  Read<signed_char> local_60;
  Read<signed_char> local_50;
  Read<signed_char> local_40;
  Read<signed_char> local_30;
  Read<signed_char> local_20;
  
  if (pad_dim == 3) {
    local_70.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (edges_are_bridges->write_).shared_alloc_.direct_ptr;
    RVar7 = get_tet_pad_dists(this,mesh,&local_70);
    pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
    this_00 = local_70.write_.shared_alloc_.alloc;
    goto LAB_0027264f;
  }
  if (pad_dim == 2) {
    uVar2 = mesh->dim_;
    if (3 < uVar2) {
LAB_00272686:
      pcVar6 = "0 <= dim_ && dim_ <= 3";
      pcVar5 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
      ;
      uVar3 = 0x33;
      goto LAB_002726bc;
    }
    if (uVar2 == 2) {
      local_60.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.write_.shared_alloc_.alloc =
               (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_60.write_.shared_alloc_.alloc)->use_count =
               (local_60.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.write_.shared_alloc_.direct_ptr =
           (edges_are_bridges->write_).shared_alloc_.direct_ptr;
      RVar7 = get_tri_pad_dists<2>(this,mesh,&local_60);
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      this_00 = local_60.write_.shared_alloc_.alloc;
LAB_0027264f:
      if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
        piVar1 = &this_00->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_00);
          operator_delete(this_00,0x48);
          pvVar4 = extraout_RDX;
        }
      }
      RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
      RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar7.write_.shared_alloc_;
    }
    if (uVar2 == 3) {
      local_50.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.write_.shared_alloc_.alloc)->use_count =
               (local_50.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_50.write_.shared_alloc_.direct_ptr =
           (edges_are_bridges->write_).shared_alloc_.direct_ptr;
      RVar7 = get_tri_pad_dists<3>(this,mesh,&local_50);
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      this_00 = local_50.write_.shared_alloc_.alloc;
      goto LAB_0027264f;
    }
  }
  else if (pad_dim == 1) {
    uVar2 = mesh->dim_;
    if (3 < uVar2) goto LAB_00272686;
    if (uVar2 == 1) {
      local_40.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.write_.shared_alloc_.alloc)->use_count =
               (local_40.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.write_.shared_alloc_.direct_ptr =
           (edges_are_bridges->write_).shared_alloc_.direct_ptr;
      RVar7 = get_edge_pad_dists<1>(this,mesh,&local_40);
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      this_00 = local_40.write_.shared_alloc_.alloc;
      goto LAB_0027264f;
    }
    if (uVar2 == 2) {
      local_30.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
      if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
          local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_30.write_.shared_alloc_.alloc =
               (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_30.write_.shared_alloc_.alloc)->use_count =
               (local_30.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_30.write_.shared_alloc_.direct_ptr =
           (edges_are_bridges->write_).shared_alloc_.direct_ptr;
      RVar7 = get_edge_pad_dists<2>(this,mesh,&local_30);
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      this_00 = local_30.write_.shared_alloc_.alloc;
      goto LAB_0027264f;
    }
    if (uVar2 == 3) {
      local_20.write_.shared_alloc_.alloc = (edges_are_bridges->write_).shared_alloc_.alloc;
      if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
          local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_20.write_.shared_alloc_.alloc =
               (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_20.write_.shared_alloc_.alloc)->use_count =
               (local_20.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_20.write_.shared_alloc_.direct_ptr =
           (edges_are_bridges->write_).shared_alloc_.direct_ptr;
      RVar7 = get_edge_pad_dists<3>(this,mesh,&local_20);
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      this_00 = local_20.write_.shared_alloc_.alloc;
      goto LAB_0027264f;
    }
  }
  pcVar6 = "false";
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_confined.cpp"
  ;
  uVar3 = 0xb5;
LAB_002726bc:
  fail("assertion %s failed at %s +%d\n",pcVar6,pcVar5,uVar3);
}

Assistant:

Reals get_pad_dists(Mesh* mesh, Int pad_dim, Read<I8> edges_are_bridges) {
  if (pad_dim == EDGE) {
    if (mesh->dim() == 3) {
      return get_edge_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_edge_pad_dists<2>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 1) {
      return get_edge_pad_dists<1>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == FACE) {
    if (mesh->dim() == 3) {
      return get_tri_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_tri_pad_dists<2>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == REGION) {
    return get_tet_pad_dists(mesh, edges_are_bridges);
  }
  OMEGA_H_NORETURN(Reals());
}